

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O2

void vkt::texture::anon_unknown_0::getBasicTexCoord2D
               (vector<float,_std::allocator<float>_> *dst,int cellNdx)

{
  int iVar1;
  
  if (texture::(anonymous_namespace)::
      getBasicTexCoord2D(std::vector<float,std::allocator<float>>&,int)::s_basicCoords == '\0') {
    iVar1 = __cxa_guard_acquire(&texture::(anonymous_namespace)::
                                 getBasicTexCoord2D(std::vector<float,std::allocator<float>>&,int)::
                                 s_basicCoords);
    if (iVar1 != 0) {
      getBasicTexCoord2D::s_basicCoords[0] = _DAT_009f0c70;
      getBasicTexCoord2D::s_basicCoords[1] = _DAT_009f0c80;
      getBasicTexCoord2D::s_basicCoords[2] = _DAT_009f0c90;
      getBasicTexCoord2D::s_basicCoords[3] = _DAT_009f0ca0;
      getBasicTexCoord2D::s_basicCoords[4] = _DAT_009f0cb0;
      getBasicTexCoord2D::s_basicCoords[5] = _DAT_009f0cc0;
      getBasicTexCoord2D::s_basicCoords[6] = _DAT_009f0cd0;
      getBasicTexCoord2D::s_basicCoords[7] = _DAT_009f0ce0;
      getBasicTexCoord2D::s_basicCoords[8] = _DAT_009f0cf0;
      getBasicTexCoord2D::s_basicCoords[9] = _DAT_009f0d00;
      getBasicTexCoord2D::s_basicCoords[10] = _DAT_009f0d10;
      getBasicTexCoord2D::s_basicCoords[0xb] = _DAT_009f0d20;
      getBasicTexCoord2D::s_basicCoords[0xc] = _DAT_009f0d30;
      getBasicTexCoord2D::s_basicCoords[0xd] = _DAT_009f0d40;
      getBasicTexCoord2D::s_basicCoords[0xe] = _DAT_009f0d50;
      getBasicTexCoord2D::s_basicCoords[0xf] = _DAT_009f0d60;
      __cxa_guard_release(&texture::(anonymous_namespace)::
                           getBasicTexCoord2D(std::vector<float,std::allocator<float>>&,int)::
                           s_basicCoords);
    }
  }
  glu::TextureTestUtil::computeQuadTexCoord2D
            (dst,&getBasicTexCoord2D::s_basicCoords[cellNdx].bottomLeft,
             &getBasicTexCoord2D::s_basicCoords[cellNdx].topRight);
  return;
}

Assistant:

static void getBasicTexCoord2D (std::vector<float>& dst, int cellNdx)
{
	static const struct
	{
		const Vec2	bottomLeft;
		const Vec2	topRight;
	} s_basicCoords[] =
	{
		{ Vec2(-0.1f,  0.1f), Vec2( 0.8f,  1.0f) },
		{ Vec2(-0.3f, -0.6f), Vec2( 0.7f,  0.4f) },
		{ Vec2(-0.3f,  0.6f), Vec2( 0.7f, -0.9f) },
		{ Vec2(-0.8f,  0.6f), Vec2( 0.7f, -0.9f) },

		{ Vec2(-0.5f, -0.5f), Vec2( 1.5f,  1.5f) },
		{ Vec2( 1.0f, -1.0f), Vec2(-1.3f,  1.0f) },
		{ Vec2( 1.2f, -1.0f), Vec2(-1.3f,  1.6f) },
		{ Vec2( 2.2f, -1.1f), Vec2(-1.3f,  0.8f) },

		{ Vec2(-1.5f,  1.6f), Vec2( 1.7f, -1.4f) },
		{ Vec2( 2.0f,  1.6f), Vec2( 2.3f, -1.4f) },
		{ Vec2( 1.3f, -2.6f), Vec2(-2.7f,  2.9f) },
		{ Vec2(-0.8f, -6.6f), Vec2( 6.0f, -0.9f) },

		{ Vec2( -8.0f,   9.0f), Vec2(  8.3f,  -7.0f) },
		{ Vec2(-16.0f,  10.0f), Vec2( 18.3f,  24.0f) },
		{ Vec2( 30.2f,  55.0f), Vec2(-24.3f,  -1.6f) },
		{ Vec2(-33.2f,  64.1f), Vec2( 32.1f, -64.1f) },
	};

	DE_ASSERT(de::inBounds(cellNdx, 0, DE_LENGTH_OF_ARRAY(s_basicCoords)));

	const Vec2& bottomLeft	= s_basicCoords[cellNdx].bottomLeft;
	const Vec2& topRight	= s_basicCoords[cellNdx].topRight;

	computeQuadTexCoord2D(dst, bottomLeft, topRight);
}